

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeadNode.h
# Opt level: O1

void __thiscall
duckdb_skiplistlib::skip_list::
HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>::
_adjRemoveRefs(HeadNode<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>
               *this,size_t level,
              Node<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>
              *pNode)

{
  pointer pNVar1;
  Node<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>
  *pNVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  pointer pNVar8;
  size_t *psVar9;
  pointer pNVar10;
  
  uVar5 = level << 4 | 8;
  do {
    pNVar1 = (this->_nodeRefs)._nodes.
             super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->_nodeRefs)._nodes.
                      super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1 >> 4) <= level)
    break;
    uVar6 = (pNode->_nodeRefs)._swapLevel;
    pNVar8 = (pNode->_nodeRefs)._nodes.
             super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pNode->_nodeRefs)._nodes.
                      super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar8 >> 4) <= uVar6)
    break;
    *(long *)((long)&pNVar8->pNode + uVar5) =
         *(long *)((long)&pNVar1->pNode + uVar5) + *(long *)((long)&pNVar8->pNode + uVar5) + -1;
    pNVar2 = pNVar1[uVar6].pNode;
    sVar3 = pNVar1[uVar6].width;
    sVar4 = pNVar8[uVar6].width;
    pNVar1[uVar6].pNode = pNVar8[uVar6].pNode;
    pNVar1[uVar6].width = sVar4;
    pNVar1 = (pNode->_nodeRefs)._nodes.
             super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + (pNode->_nodeRefs)._swapLevel;
    pNVar1->pNode = pNVar2;
    pNVar1->width = sVar3;
    uVar6 = (pNode->_nodeRefs)._swapLevel + 1;
    (pNode->_nodeRefs)._swapLevel = uVar6;
    level = level + 1;
    uVar5 = uVar5 + 0x10;
  } while (uVar6 < (ulong)((long)(pNode->_nodeRefs)._nodes.
                                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pNode->_nodeRefs)._nodes.
                                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 4));
  pNVar1 = (this->_nodeRefs)._nodes.
           super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (long)(this->_nodeRefs)._nodes.
                super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1 >> 4;
  lVar7 = uVar5 - level;
  if (level <= uVar5 && lVar7 != 0) {
    psVar9 = &pNVar1[level].width;
    do {
      *psVar9 = *psVar9 - 1;
      psVar9 = psVar9 + 2;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  pNVar8 = (this->_nodeRefs)._nodes.
           super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pNVar10 = pNVar8;
  while ((pNVar8 != pNVar1 &&
         (pNVar10 = pNVar10 + -1,
         pNVar10->pNode ==
         (Node<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>
          *)0x0))) {
    pNVar8 = pNVar8 + -1;
    (this->_nodeRefs)._nodes.
    super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_double>,_duckdb::SkipLess<std::pair<unsigned_long,_double>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pNVar8;
  }
  return;
}

Assistant:

void HeadNode<T, _Compare>::_adjRemoveRefs(size_t level,
                                           Node<T, _Compare> *pNode) {
    assert(pNode);
    SwappableNodeRefStack<T, _Compare> &thatRefs = pNode->nodeRefs();

    // Swap all remaining levels
    // This assertion checks that if swapping can take place we must be at the
    // same level.
    assert(! thatRefs.canSwap() || level == thatRefs.swapLevel());
    while (level < _nodeRefs.height() && thatRefs.canSwap()) {
        assert(level == thatRefs.swapLevel());
        // Compute the new width for the new node
        thatRefs[level].width += _nodeRefs[level].width - 1;
        thatRefs.swap(_nodeRefs);
        ++level;
        if (! thatRefs.canSwap()) {
            break;
        }
    }
    assert(! thatRefs.canSwap());
    // Decrement my widths as my references are now going over the top of
    // pNode.
    while (level < _nodeRefs.height()) {
        _nodeRefs[level++].width -= 1;
    }
    // Decrement my stack while top has a NULL pointer.
    while (_nodeRefs.height() && ! _nodeRefs[_nodeRefs.height() - 1].pNode) {
        _nodeRefs.pop_back();
    }
}